

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

void __thiscall
Pool::RetrieveReadyEdges
          (Pool *this,set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *ready_queue)

{
  const_iterator __last;
  Edge *edge;
  Edge *local_30;
  
  __last._M_node = (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)__last._M_node != &(this->delayed_)._M_t._M_impl.super__Rb_tree_header
         && (local_30 = *(Edge **)(__last._M_node + 1), this->current_use_ < this->depth_))) {
    std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
    _M_insert_unique<Edge*const&>
              ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>> *
               )ready_queue,&local_30);
    if (this->depth_ != 0) {
      this->current_use_ = this->current_use_ + 1;
    }
    __last._M_node = (_Base_ptr)std::_Rb_tree_increment(__last._M_node);
  }
  std::
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_bool_(*)(const_Edge_*,_const_Edge_*),_std::allocator<Edge_*>_>
  ::_M_erase_aux(&(this->delayed_)._M_t,
                 (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,__last);
  return;
}

Assistant:

void Pool::RetrieveReadyEdges(set<Edge*>* ready_queue) {
  DelayedEdges::iterator it = delayed_.begin();
  while (it != delayed_.end()) {
    Edge* edge = *it;
    if (current_use_ + edge->weight() > depth_)
      break;
    ready_queue->insert(edge);
    EdgeScheduled(*edge);
    ++it;
  }
  delayed_.erase(delayed_.begin(), it);
}